

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncodingHandlerPtr xmlFindCharEncodingHandler(char *name)

{
  int iVar1;
  xmlCharEncoding enc_00;
  char *pcVar2;
  char *canon;
  char local_b8 [4];
  int i;
  char upper [100];
  iconv_t local_48;
  iconv_t icv_out;
  iconv_t icv_in;
  xmlCharEncodingHandlerPtr enc;
  xmlCharEncoding alias;
  char *norig;
  char *nalias;
  char *name_local;
  
  if (handlers == (xmlCharEncodingHandlerPtr *)0x0) {
    xmlInitCharEncodingHandlers();
  }
  if (name == (char *)0x0) {
    name_local = (char *)xmlDefaultCharEncodingHandler;
  }
  else if (*name == '\0') {
    name_local = (char *)xmlDefaultCharEncodingHandler;
  }
  else {
    pcVar2 = xmlGetEncodingAlias(name);
    nalias = name;
    if (pcVar2 != (char *)0x0) {
      nalias = pcVar2;
    }
    for (canon._4_4_ = 0; canon._4_4_ < 99; canon._4_4_ = canon._4_4_ + 1) {
      iVar1 = toupper((int)nalias[canon._4_4_]);
      local_b8[canon._4_4_] = (char)iVar1;
      if (local_b8[canon._4_4_] == '\0') break;
    }
    local_b8[canon._4_4_] = '\0';
    if (handlers != (xmlCharEncodingHandlerPtr *)0x0) {
      for (canon._4_4_ = 0; canon._4_4_ < nbCharEncodingHandler; canon._4_4_ = canon._4_4_ + 1) {
        iVar1 = strcmp(local_b8,handlers[canon._4_4_]->name);
        if (iVar1 == 0) {
          return handlers[canon._4_4_];
        }
      }
    }
    icv_out = iconv_open("UTF-8",nalias);
    local_48 = iconv_open(nalias,"UTF-8");
    if (icv_out == (iconv_t)0xffffffffffffffff) {
      icv_out = iconv_open("UTF-8",local_b8);
    }
    if (local_48 == (iconv_t)0xffffffffffffffff) {
      local_48 = iconv_open(local_b8,"UTF-8");
    }
    if ((icv_out == (iconv_t)0xffffffffffffffff) || (local_48 == (iconv_t)0xffffffffffffffff)) {
      if ((icv_out != (iconv_t)0xffffffffffffffff) || (local_48 != (iconv_t)0xffffffffffffffff)) {
        xmlEncodingErr(XML_ERR_INTERNAL_ERROR,"iconv : problems with filters for \'%s\'\n",nalias);
      }
      enc_00 = xmlParseCharEncoding(name);
      if (((enc_00 == XML_CHAR_ENCODING_ERROR) ||
          (pcVar2 = xmlGetCharEncodingName(enc_00), pcVar2 == (char *)0x0)) ||
         (iVar1 = strcmp(nalias,pcVar2), iVar1 == 0)) {
        name_local = (char *)0x0;
      }
      else {
        name_local = (char *)xmlFindCharEncodingHandler(pcVar2);
      }
    }
    else {
      name_local = (char *)(*xmlMalloc)(0x28);
      if (name_local == (char *)0x0) {
        iconv_close(icv_out);
        iconv_close(local_48);
        name_local = (char *)0x0;
      }
      else {
        memset(name_local,0,0x28);
        pcVar2 = (*xmlMemStrdup)(nalias);
        *(char **)name_local = pcVar2;
        name_local[8] = '\0';
        name_local[9] = '\0';
        name_local[10] = '\0';
        name_local[0xb] = '\0';
        name_local[0xc] = '\0';
        name_local[0xd] = '\0';
        name_local[0xe] = '\0';
        name_local[0xf] = '\0';
        name_local[0x10] = '\0';
        name_local[0x11] = '\0';
        name_local[0x12] = '\0';
        name_local[0x13] = '\0';
        name_local[0x14] = '\0';
        name_local[0x15] = '\0';
        name_local[0x16] = '\0';
        name_local[0x17] = '\0';
        *(iconv_t *)(name_local + 0x18) = icv_out;
        *(iconv_t *)(name_local + 0x20) = local_48;
      }
    }
  }
  return (xmlCharEncodingHandlerPtr)name_local;
}

Assistant:

xmlCharEncodingHandlerPtr
xmlFindCharEncodingHandler(const char *name) {
    const char *nalias;
    const char *norig;
    xmlCharEncoding alias;
#ifdef LIBXML_ICONV_ENABLED
    xmlCharEncodingHandlerPtr enc;
    iconv_t icv_in, icv_out;
#endif /* LIBXML_ICONV_ENABLED */
#ifdef LIBXML_ICU_ENABLED
    xmlCharEncodingHandlerPtr encu;
    uconv_t *ucv_in, *ucv_out;
#endif /* LIBXML_ICU_ENABLED */
    char upper[100];
    int i;

    if (handlers == NULL) xmlInitCharEncodingHandlers();
    if (name == NULL) return(xmlDefaultCharEncodingHandler);
    if (name[0] == 0) return(xmlDefaultCharEncodingHandler);

    /*
     * Do the alias resolution
     */
    norig = name;
    nalias = xmlGetEncodingAlias(name);
    if (nalias != NULL)
	name = nalias;

    /*
     * Check first for directly registered encoding names
     */
    for (i = 0;i < 99;i++) {
        upper[i] = toupper(name[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    if (handlers != NULL) {
        for (i = 0;i < nbCharEncodingHandler; i++) {
            if (!strcmp(upper, handlers[i]->name)) {
#ifdef DEBUG_ENCODING
                xmlGenericError(xmlGenericErrorContext,
                        "Found registered handler for encoding %s\n", name);
#endif
                return(handlers[i]);
            }
        }
    }

#ifdef LIBXML_ICONV_ENABLED
    /* check whether iconv can handle this */
    icv_in = iconv_open("UTF-8", name);
    icv_out = iconv_open(name, "UTF-8");
    if (icv_in == (iconv_t) -1) {
        icv_in = iconv_open("UTF-8", upper);
    }
    if (icv_out == (iconv_t) -1) {
	icv_out = iconv_open(upper, "UTF-8");
    }
    if ((icv_in != (iconv_t) -1) && (icv_out != (iconv_t) -1)) {
	    enc = (xmlCharEncodingHandlerPtr)
	          xmlMalloc(sizeof(xmlCharEncodingHandler));
	    if (enc == NULL) {
	        iconv_close(icv_in);
	        iconv_close(icv_out);
		return(NULL);
	    }
            memset(enc, 0, sizeof(xmlCharEncodingHandler));
	    enc->name = xmlMemStrdup(name);
	    enc->input = NULL;
	    enc->output = NULL;
	    enc->iconv_in = icv_in;
	    enc->iconv_out = icv_out;
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
		    "Found iconv handler for encoding %s\n", name);
#endif
	    return enc;
    } else if ((icv_in != (iconv_t) -1) || icv_out != (iconv_t) -1) {
	    xmlEncodingErr(XML_ERR_INTERNAL_ERROR,
		    "iconv : problems with filters for '%s'\n", name);
    }
#endif /* LIBXML_ICONV_ENABLED */
#ifdef LIBXML_ICU_ENABLED
    /* check whether icu can handle this */
    ucv_in = openIcuConverter(name, 1);
    ucv_out = openIcuConverter(name, 0);
    if (ucv_in != NULL && ucv_out != NULL) {
	    encu = (xmlCharEncodingHandlerPtr)
	           xmlMalloc(sizeof(xmlCharEncodingHandler));
	    if (encu == NULL) {
                closeIcuConverter(ucv_in);
                closeIcuConverter(ucv_out);
		return(NULL);
	    }
            memset(encu, 0, sizeof(xmlCharEncodingHandler));
	    encu->name = xmlMemStrdup(name);
	    encu->input = NULL;
	    encu->output = NULL;
	    encu->uconv_in = ucv_in;
	    encu->uconv_out = ucv_out;
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
		    "Found ICU converter handler for encoding %s\n", name);
#endif
	    return encu;
    } else if (ucv_in != NULL || ucv_out != NULL) {
            closeIcuConverter(ucv_in);
            closeIcuConverter(ucv_out);
	    xmlEncodingErr(XML_ERR_INTERNAL_ERROR,
		    "ICU converter : problems with filters for '%s'\n", name);
    }
#endif /* LIBXML_ICU_ENABLED */

#ifdef DEBUG_ENCODING
    xmlGenericError(xmlGenericErrorContext,
	    "No handler found for encoding %s\n", name);
#endif

    /*
     * Fallback using the canonical names
     */
    alias = xmlParseCharEncoding(norig);
    if (alias != XML_CHAR_ENCODING_ERROR) {
        const char* canon;
        canon = xmlGetCharEncodingName(alias);
        if ((canon != NULL) && (strcmp(name, canon))) {
	    return(xmlFindCharEncodingHandler(canon));
        }
    }

    /* If "none of the above", give up */
    return(NULL);
}